

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<char>_> *
kj::parse::Times_<const_kj::parse::Any__&>::Impl<kj::parse::IteratorInput<char,_const_char_*>,_char>
::apply(Maybe<kj::Array<char>_> *__return_storage_ptr__,Any_ *subParser,uint count,
       IteratorInput<char,_const_char_*> *input)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  ulong count_00;
  ArrayBuilder<char> results;
  Array<char> result;
  ArrayBuilder<char> local_58;
  Array<char> local_38;
  
  count_00 = (ulong)count;
  pcVar2 = kj::_::HeapArrayDisposer::allocateUninitialized<char>(count_00);
  local_58.endPtr = pcVar2 + count_00;
  local_58.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  uVar3 = 0;
  local_58.pos = pcVar2;
  do {
    if (count_00 <= uVar3) {
      local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_58.ptr = (char *)0x0;
      local_58.pos = (char *)0x0;
      local_58.endPtr = (char *)0x0;
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.ptr = pcVar2;
      (__return_storage_ptr__->ptr).field_1.value.size_ = uVar3;
      (__return_storage_ptr__->ptr).field_1.value.disposer =
           (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_38.ptr = (char *)0x0;
      local_38.size_ = 0;
      Array<char>::~Array(&local_38);
LAB_00261e24:
      ArrayBuilder<char>::dispose(&local_58);
      return __return_storage_ptr__;
    }
    pcVar1 = input->pos;
    if (pcVar1 == input->end) {
      (__return_storage_ptr__->ptr).isSet = false;
      local_58.ptr = pcVar2;
      goto LAB_00261e24;
    }
    input->pos = pcVar1 + 1;
    pcVar2[uVar3] = *pcVar1;
    local_58.pos = pcVar2 + uVar3 + 1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, uint count, Input& input) {
    auto results = heapArrayBuilder<OutputType<SubParser, Input>>(count);

    while (results.size() < count) {
      if (input.atEnd()) {
        return nullptr;
      } else KJ_IF_MAYBE(subResult, subParser(input)) {
        results.add(kj::mv(*subResult));
      } else {
        return nullptr;
      }
    }

    return results.finish();
  }